

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O3

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  uv_udp_t *puVar3;
  code **ppcVar4;
  undefined8 *extraout_RDX;
  code *pcVar5;
  undefined8 *puVar6;
  void *apvVar7 [2];
  int64_t eval_b_13;
  int64_t eval_b_14;
  sockaddr_in addr;
  sockaddr_in addr3;
  sockaddr_in addr2;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  uv_udp_send_t req4;
  uv_udp_send_t req3;
  code *pcStack_5a8;
  code *pcStack_5a0;
  undefined8 uStack_590;
  code *pcStack_588;
  code *pcStack_580;
  undefined8 uStack_570;
  undefined1 auStack_568 [16];
  undefined1 local_558 [8];
  uv_loop_t *local_550;
  undefined1 local_548 [16];
  anon_union_32_2_8d26fa8b_for_u local_538;
  undefined1 local_518 [16];
  uv_handle_t *local_508 [40];
  uv_handle_t *local_3c8 [40];
  long local_288 [40];
  long local_148 [40];
  
  can_recverr = '\x01';
  local_3c8[0] = (uv_handle_t *)0x0;
  auStack_568._8_8_ = (uv_loop_t *)0x18b291;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_558 + 0x10);
  local_508[0] = (uv_handle_t *)(long)iVar1;
  if (local_3c8[0] == local_508[0]) {
    local_3c8[0] = (uv_handle_t *)0x0;
    auStack_568._8_8_ = (uv_loop_t *)0x18b2cd;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,local_518);
    local_508[0] = (uv_handle_t *)(long)iVar1;
    if (local_3c8[0] != local_508[0]) goto LAB_0018b7b5;
    local_3c8[0] = (uv_handle_t *)0x0;
    auStack_568._8_8_ = (uv_loop_t *)0x18b309;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a5,(undefined1 *)((long)local_538.reserved + 0x10));
    local_508[0] = (uv_handle_t *)(long)iVar1;
    if (local_3c8[0] != local_508[0]) goto LAB_0018b7c7;
    auStack_568._8_8_ = (uv_loop_t *)0x18b328;
    uVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x18b337;
    iVar1 = uv_timer_init(uVar2,&timer);
    local_3c8[0] = (uv_handle_t *)(long)iVar1;
    local_508[0] = (uv_handle_t *)0x0;
    if (local_3c8[0] != (uv_handle_t *)0x0) goto LAB_0018b7d9;
    auStack_568._8_8_ = (uv_loop_t *)0x18b377;
    iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
    local_3c8[0] = (uv_handle_t *)(long)iVar1;
    local_508[0] = (uv_handle_t *)0x0;
    if (local_3c8[0] != (uv_handle_t *)0x0) goto LAB_0018b7eb;
    auStack_568._8_8_ = (uv_loop_t *)0x18b3a2;
    uVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x18b3b1;
    iVar1 = uv_udp_init(uVar2,&client);
    local_3c8[0] = (uv_handle_t *)(long)iVar1;
    local_508[0] = (uv_handle_t *)0x0;
    if (local_3c8[0] != (uv_handle_t *)0x0) goto LAB_0018b7fd;
    auStack_568._8_8_ = (uv_loop_t *)0x18b3ea;
    iVar1 = uv_udp_bind(&client,local_518,0);
    local_3c8[0] = (uv_handle_t *)(long)iVar1;
    local_508[0] = (uv_handle_t *)0x0;
    if (local_3c8[0] != (uv_handle_t *)0x0) goto LAB_0018b80f;
    auStack_568._8_8_ = (uv_loop_t *)0x18b42a;
    iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
    local_3c8[0] = (uv_handle_t *)(long)iVar1;
    local_508[0] = (uv_handle_t *)0x0;
    if (local_3c8[0] != (uv_handle_t *)0x0) goto LAB_0018b821;
    auStack_568._8_8_ = (uv_loop_t *)0x18b461;
    local_538._0_16_ = uv_buf_init("PING",4);
    auStack_568._8_8_ = (uv_loop_t *)0x18b495;
    iVar1 = uv_udp_send(local_3c8,&client,local_558 + 0x20,1,local_558 + 0x10,send_cb);
    local_508[0] = (uv_handle_t *)(long)iVar1;
    local_148[0] = 0;
    if (local_508[0] != (uv_handle_t *)0x0) goto LAB_0018b833;
    auStack_568._8_8_ = (uv_loop_t *)0x18b4cc;
    apvVar7 = (void * [2])uv_buf_init("PANG",4);
    auStack_568._8_8_ = (uv_loop_t *)0x18b4fd;
    local_538._0_16_ = (undefined1  [16])apvVar7;
    iVar1 = uv_udp_send(local_508,&client,local_558 + 0x20,1,local_558 + 0x10,send_cb);
    local_148[0] = (long)iVar1;
    local_288[0] = 0;
    if (local_148[0] != 0) goto LAB_0018b845;
    auStack_568._8_8_ = (uv_loop_t *)0x18b52e;
    uVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x18b53d;
    iVar1 = uv_udp_init(uVar2,&client2);
    local_148[0] = (long)iVar1;
    local_288[0] = 0;
    if (local_148[0] != 0) goto LAB_0018b85a;
    auStack_568._8_8_ = (uv_loop_t *)0x18b57f;
    iVar1 = uv_udp_bind(&client2,(undefined1 *)((long)local_538.reserved + 0x10),0x20);
    local_148[0] = (long)iVar1;
    local_288[0] = 0;
    if (local_148[0] != 0) goto LAB_0018b86f;
    auStack_568._8_8_ = (uv_loop_t *)0x18b5c5;
    iVar1 = uv_udp_recv_start(&client2,alloc_cb,recv_cb);
    local_148[0] = (long)iVar1;
    local_288[0] = 0;
    if (local_148[0] != 0) goto LAB_0018b884;
    auStack_568._8_8_ = (uv_loop_t *)0x18b602;
    apvVar7 = (void * [2])uv_buf_init("PING",4);
    auStack_568._8_8_ = (uv_loop_t *)0x18b636;
    local_538._0_16_ = (undefined1  [16])apvVar7;
    iVar1 = uv_udp_send(local_148,&client2,local_558 + 0x20,1,local_558 + 0x10,send_cb_recverr);
    local_288[0] = (long)iVar1;
    local_558 = (undefined1  [8])0x0;
    if (local_288[0] != 0) goto LAB_0018b899;
    auStack_568._8_8_ = (uv_loop_t *)0x18b66b;
    apvVar7 = (void * [2])uv_buf_init("PANG",4);
    auStack_568._8_8_ = (uv_loop_t *)0x18b69f;
    local_538._0_16_ = (undefined1  [16])apvVar7;
    iVar1 = uv_udp_send(local_288,&client2,local_558 + 0x20,1,local_558 + 0x10,send_cb_recverr);
    local_558 = (undefined1  [8])(long)iVar1;
    local_550 = (uv_loop_t *)0x0;
    if (local_558 != (undefined1  [8])0x0) goto LAB_0018b8a9;
    auStack_568._8_8_ = (uv_loop_t *)0x18b6c2;
    uVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x18b6cc;
    uv_run(uVar2,0);
    local_558 = (undefined1  [8])(long)send_cb_called;
    local_550 = (uv_loop_t *)0x4;
    if (local_558 != (undefined1  [8])0x4) goto LAB_0018b8b6;
    local_558 = (undefined1  [8])(long)recv_cb_called;
    local_550 = (uv_loop_t *)(long)alloc_cb_called;
    if (local_558 != (undefined1  [8])local_550) goto LAB_0018b8c3;
    local_558 = (undefined1  [8])(long)timer_cb_called;
    local_550 = (uv_loop_t *)0x1;
    if (local_558 != (undefined1  [8])0x1) goto LAB_0018b8d0;
    local_558 = (undefined1  [8])(long)close_cb_called;
    local_550 = (uv_loop_t *)0x3;
    if (local_558 != (undefined1  [8])0x3) goto LAB_0018b8dd;
    auStack_568._8_8_ = (uv_loop_t *)0x18b760;
    uVar2 = uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x18b774;
    uv_walk(uVar2,close_walk_cb,0);
    pcVar5 = (code *)0x0;
    auStack_568._8_8_ = (uv_loop_t *)0x18b77e;
    uv_run(uVar2);
    auStack_568._8_8_ = (uv_loop_t *)0x18b783;
    puVar3 = (uv_udp_t *)uv_default_loop();
    auStack_568._8_8_ = (uv_loop_t *)0x18b78b;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      auStack_568._8_8_ = (uv_loop_t *)0x18b798;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_568._8_8_ = (uv_loop_t *)0x18b7b5;
    run_test_udp_send_unreachable_cold_1();
LAB_0018b7b5:
    auStack_568._8_8_ = (uv_loop_t *)0x18b7c7;
    run_test_udp_send_unreachable_cold_2();
LAB_0018b7c7:
    auStack_568._8_8_ = (uv_loop_t *)0x18b7d9;
    run_test_udp_send_unreachable_cold_3();
LAB_0018b7d9:
    auStack_568._8_8_ = (uv_loop_t *)0x18b7eb;
    run_test_udp_send_unreachable_cold_4();
LAB_0018b7eb:
    auStack_568._8_8_ = (uv_loop_t *)0x18b7fd;
    run_test_udp_send_unreachable_cold_5();
LAB_0018b7fd:
    auStack_568._8_8_ = (uv_loop_t *)0x18b80f;
    run_test_udp_send_unreachable_cold_6();
LAB_0018b80f:
    auStack_568._8_8_ = (uv_loop_t *)0x18b821;
    run_test_udp_send_unreachable_cold_7();
LAB_0018b821:
    auStack_568._8_8_ = (uv_loop_t *)0x18b833;
    run_test_udp_send_unreachable_cold_8();
LAB_0018b833:
    auStack_568._8_8_ = (uv_loop_t *)0x18b845;
    run_test_udp_send_unreachable_cold_9();
LAB_0018b845:
    auStack_568._8_8_ = (uv_loop_t *)0x18b85a;
    run_test_udp_send_unreachable_cold_10();
LAB_0018b85a:
    auStack_568._8_8_ = (uv_loop_t *)0x18b86f;
    run_test_udp_send_unreachable_cold_11();
LAB_0018b86f:
    auStack_568._8_8_ = (uv_loop_t *)0x18b884;
    run_test_udp_send_unreachable_cold_12();
LAB_0018b884:
    auStack_568._8_8_ = (uv_loop_t *)0x18b899;
    run_test_udp_send_unreachable_cold_13();
LAB_0018b899:
    auStack_568._8_8_ = (uv_loop_t *)0x18b8a9;
    run_test_udp_send_unreachable_cold_14();
LAB_0018b8a9:
    auStack_568._8_8_ = (uv_loop_t *)0x18b8b6;
    run_test_udp_send_unreachable_cold_15();
LAB_0018b8b6:
    auStack_568._8_8_ = (uv_loop_t *)0x18b8c3;
    run_test_udp_send_unreachable_cold_16();
LAB_0018b8c3:
    auStack_568._8_8_ = (uv_loop_t *)0x18b8d0;
    run_test_udp_send_unreachable_cold_17();
LAB_0018b8d0:
    auStack_568._8_8_ = (uv_loop_t *)0x18b8dd;
    run_test_udp_send_unreachable_cold_18();
LAB_0018b8dd:
    puVar3 = (uv_udp_t *)local_558;
    pcVar5 = (code *)(local_558 + 8);
    auStack_568._8_8_ = (uv_loop_t *)0x18b8ea;
    run_test_udp_send_unreachable_cold_19();
  }
  auStack_568._8_8_ = timer_cb;
  run_test_udp_send_unreachable_cold_20();
  if (puVar3 == (uv_udp_t *)&timer) {
    timer_cb_called = timer_cb_called + 1;
    auStack_568._0_8_ = (void *)0x18b915;
    uv_close(&client,close_cb);
    if (can_recverr == '\x01') {
      auStack_568._0_8_ = (void *)0x18b931;
      uv_close(&client2,close_cb);
    }
    iVar1 = uv_close(&timer,close_cb);
    return iVar1;
  }
  auStack_568._0_8_ = alloc_cb;
  timer_cb_cold_1();
  ppcVar4 = (code **)CONCAT71(0x5b11,puVar3 == &client2 || puVar3 == &client);
  if (puVar3 == &client2 || puVar3 == &client) {
    uStack_570 = 0x10000;
    auStack_568._0_8_ = pcVar5;
    if ((long)pcVar5 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      alloc_cb_called = alloc_cb_called + 1;
      return 0x5b1230;
    }
  }
  else {
    pcStack_580 = (code *)0x18b9a8;
    alloc_cb_cold_1();
  }
  puVar3 = (uv_udp_t *)auStack_568;
  puVar6 = &uStack_570;
  pcStack_580 = recv_cb;
  alloc_cb_cold_2();
  if (puVar3 == &client2 || puVar3 == &client) {
    recv_cb_called = recv_cb_called + 1;
    if ((long)puVar6 < 0) goto LAB_0018b9f9;
    pcStack_580._0_4_ = extraout_EAX;
    if (puVar6 != (undefined8 *)0x0) {
      if (ppcVar4 != (code **)0x0) {
        return extraout_EAX;
      }
      pcStack_588 = (code *)0x18b9ed;
      recv_cb_cold_2();
    }
    iVar1 = (int)puVar6;
    if (ppcVar4 == (code **)0x0) {
      return (int)pcStack_580;
    }
  }
  else {
    pcStack_588 = (code *)0x18b9f9;
    recv_cb_cold_1();
LAB_0018b9f9:
    iVar1 = (int)puVar6;
    pcStack_588 = (code *)0x18b9fe;
    recv_cb_cold_4();
  }
  pcStack_588 = send_cb;
  recv_cb_cold_3();
  if (ppcVar4 == (code **)0x0) {
    pcStack_5a0 = (code *)0x18ba5d;
    send_cb_cold_4();
LAB_0018ba5d:
    pcStack_5a0 = (code *)0x18ba62;
    send_cb_cold_1();
    ppcVar4 = &pcStack_588;
    iVar1 = (int)&uStack_590;
    pcStack_5a0 = (code *)0x18ba71;
    send_cb_cold_2();
  }
  else {
    if (iVar1 != 0) goto LAB_0018ba5d;
    pcStack_588 = (code *)0x0;
    uStack_590 = 0;
    puVar3 = (uv_udp_t *)ppcVar4[8];
    iVar1 = 0;
    if (puVar3 == &client2 || puVar3 == &client) {
      send_cb_called = send_cb_called + 1;
      return (int)CONCAT71((int7)((ulong)puVar3 >> 8),puVar3 == &client2 || puVar3 == &client);
    }
  }
  pcStack_5a0 = send_cb_recverr;
  send_cb_cold_3();
  if (ppcVar4 == (code **)0x0) {
    pcStack_5a8 = (code *)0x18bab4;
    send_cb_recverr_cold_3();
  }
  else {
    if ((iVar1 != -0x6f) && (iVar1 != 0)) goto LAB_0018bab9;
    if ((uv_udp_t *)ppcVar4[8] == &client2 || (uv_udp_t *)ppcVar4[8] == &client) {
      send_cb_called = send_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  pcStack_5a8 = (code *)0x18bab9;
  send_cb_recverr_cold_1();
LAB_0018bab9:
  pcStack_5a8 = close_cb;
  send_cb_recverr_cold_2();
  pcStack_5a8 = (code *)0x1;
  iVar1 = uv_is_closing();
  if (pcStack_5a8 == (code *)(long)iVar1) {
    close_cb_called = close_cb_called + 1;
    return (int)pcStack_5a8;
  }
  ppcVar4 = &pcStack_5a8;
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  struct sockaddr_in addr3;
  uv_udp_send_t req1, req2, req3, req4;
  uv_buf_t buf;
  int r;

#ifdef __linux__
  can_recverr = 1;
#endif

  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));
  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT_3, &addr3));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT_EQ(r, 0);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT_EQ(r, 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_EQ(r, 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT_EQ(r, 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_EQ(r, 0);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_EQ(r, 0);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_EQ(r, 0);

  if (can_recverr) {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_EQ(r, 0);

    r = uv_udp_bind(&client2,
                    (const struct sockaddr*) &addr3,
                    UV_UDP_LINUX_RECVERR);
    ASSERT_EQ(r, 0);

    r = uv_udp_recv_start(&client2, alloc_cb, recv_cb);
    ASSERT_EQ(r, 0);

    /* client sends "PING", then "PANG" */
    buf = uv_buf_init("PING", 4);

    r = uv_udp_send(&req3,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_EQ(r, 0);

    buf = uv_buf_init("PANG", 4);

    r = uv_udp_send(&req4,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_EQ(r, 0);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(send_cb_called, (long)(can_recverr ? 4 : 2));
  ASSERT_EQ(recv_cb_called, alloc_cb_called);
  ASSERT_EQ(timer_cb_called, 1);
  ASSERT_EQ(close_cb_called, (long)(can_recverr ? 3 : 2));

  MAKE_VALGRIND_HAPPY();
  return 0;
}